

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void __thiscall
Omega_h::elements_across_sides_count_functor::elements_across_sides_count_functor
          (elements_across_sides_count_functor *this,Int nsides_per_elem_arg,
          Read<int> *elem_side2side_arg,Read<signed_char> *side_is_exposed_arg,
          Write<int> *degrees_arg)

{
  Write<int> *degrees_arg_local;
  Read<signed_char> *side_is_exposed_arg_local;
  Read<int> *elem_side2side_arg_local;
  Int nsides_per_elem_arg_local;
  elements_across_sides_count_functor *this_local;
  
  this->nsides_per_elem = nsides_per_elem_arg;
  Read<int>::Read(&this->elem_side2side,elem_side2side_arg);
  Read<signed_char>::Read(&this->side_is_exposed,side_is_exposed_arg);
  Write<int>::Write(&this->degrees,degrees_arg);
  return;
}

Assistant:

elements_across_sides_count_functor(
      Int nsides_per_elem_arg,
      Read<LO> const& elem_side2side_arg,
      Read<I8> const& side_is_exposed_arg,
      Write<LO> const& degrees_arg
      )
    :nsides_per_elem(nsides_per_elem_arg)
    ,elem_side2side(elem_side2side_arg)
    ,side_is_exposed(side_is_exposed_arg)
    ,degrees(degrees_arg)
  {}